

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O3

void embree::storePFM(Ref<embree::Image> *img,FileName *fileName)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  Image *pIVar4;
  long lVar5;
  long lVar6;
  Color4 c;
  fstream file;
  undefined1 auStack_248 [16];
  long local_238 [2];
  long local_228;
  undefined4 auStack_21c [125];
  
  std::fstream::fstream(local_238);
  lVar6 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar6) = 5;
  std::ios::clear((int)auStack_248 + (int)lVar6 + 0x10);
  std::fstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"PF",2);
  cVar2 = (char)(ostream *)&local_228;
  std::ios::widen((char)*(undefined8 *)(local_228 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>(-1.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pIVar4 = img->ptr;
  lVar6 = pIVar4->height - 1;
  if (-1 < lVar6) {
    do {
      if (0 < (long)pIVar4->width) {
        lVar5 = 0;
        do {
          (*(pIVar4->super_RefCount)._vptr_RefCount[4])(auStack_248,pIVar4,lVar5,lVar6);
          std::ostream::write((char *)&local_228,(long)auStack_248);
          lVar5 = lVar5 + 1;
          pIVar4 = img->ptr;
        } while (lVar5 < (long)pIVar4->width);
      }
      bVar1 = 0 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar1);
  }
  std::fstream::~fstream(local_238);
  return;
}

Assistant:

void storePFM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "PF" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << -1.0f << std::endl;

    /* write image */
    for (ssize_t y=img->height-1; y>=0; y--) {
      for (ssize_t x=0; x<(ssize_t)img->width; x++) {
        const Color4 c = img->get(x,y);
        file.write((char*)&c,3*sizeof(float));
      }
    }
  }